

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWRepository.cxx
# Opt level: O2

bool __thiscall cmCPackIFWRepository::PatchUpdatesXml(cmCPackIFWRepository *this)

{
  string *__lhs;
  bool bVar1;
  string updatesPatchXml;
  string updatesXml;
  cmXMLWriter xout;
  cmCPackeIFWUpdatesPatcher patcher;
  cmGeneratedFileStream fout;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  cmXMLWriter local_2f0;
  cmCPackeIFWUpdatesPatcher local_298;
  cmGeneratedFileStream local_258;
  
  __lhs = &this->Directory;
  if (((this->Directory)._M_string_length == 0) &&
     ((this->super_cmCPackIFWCommon).Generator != (cmCPackIFWGenerator *)0x0)) {
    std::__cxx11::string::_M_assign((string *)__lhs);
  }
  std::operator+(&local_310,__lhs,"/repository/Updates.xml");
  std::operator+(&local_330,__lhs,"/repository/UpdatesPatch.xml");
  cmGeneratedFileStream::cmGeneratedFileStream(&local_258,&local_330,false,None);
  cmXMLWriter::cmXMLWriter(&local_2f0,(ostream *)&local_258,0);
  cmXMLWriter::StartDocument(&local_2f0,"UTF-8");
  cmCPackIFWCommon::WriteGeneratedByToStrim(&this->super_cmCPackIFWCommon,&local_2f0);
  cmCPackeIFWUpdatesPatcher::cmCPackeIFWUpdatesPatcher(&local_298,this,&local_2f0);
  cmXMLParser::ParseFile(&local_298.super_cmXMLParser,local_310._M_dataplus._M_p);
  cmXMLParser::~cmXMLParser(&local_298.super_cmXMLParser);
  cmXMLWriter::EndDocument(&local_2f0);
  cmGeneratedFileStream::Close(&local_258);
  bVar1 = cmSystemTools::RenameFile(&local_330,&local_310);
  cmXMLWriter::~cmXMLWriter(&local_2f0);
  cmGeneratedFileStream::~cmGeneratedFileStream(&local_258);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_310);
  return bVar1;
}

Assistant:

bool cmCPackIFWRepository::PatchUpdatesXml()
{
  // Lazy directory initialization
  if (this->Directory.empty() && this->Generator) {
    this->Directory = this->Generator->toplevel;
  }

  // Filenames
  std::string updatesXml = this->Directory + "/repository/Updates.xml";
  std::string updatesPatchXml =
    this->Directory + "/repository/UpdatesPatch.xml";

  // Output stream
  cmGeneratedFileStream fout(updatesPatchXml);
  cmXMLWriter xout(fout);

  xout.StartDocument();

  this->WriteGeneratedByToStrim(xout);

  // Patch
  {
    cmCPackeIFWUpdatesPatcher patcher(this, xout);
    patcher.ParseFile(updatesXml.data());
  }

  xout.EndDocument();

  fout.Close();

  return cmSystemTools::RenameFile(updatesPatchXml, updatesXml);
}